

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int spacePush(xmlParserCtxtPtr ctxt,int val)

{
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = ctxt->spaceNr;
  uVar1 = ctxt->spaceMax;
  if (iVar2 < (int)uVar1) {
    piVar3 = ctxt->spaceTab;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar5 = 10;
    }
    else {
      if (999999999 < uVar1) goto LAB_0013ceb6;
      uVar4 = uVar1 + 1 >> 1;
      uVar5 = uVar4 + uVar1;
      if (1000000000 - uVar4 < uVar1) {
        uVar5 = 1000000000;
      }
    }
    piVar3 = (int *)(*xmlRealloc)(ctxt->spaceTab,(ulong)uVar5 << 2);
    if (piVar3 == (int *)0x0) {
LAB_0013ceb6:
      xmlCtxtErrMemory(ctxt);
      return extraout_EAX;
    }
    ctxt->spaceTab = piVar3;
    ctxt->spaceMax = uVar5;
    iVar2 = ctxt->spaceNr;
  }
  piVar3[iVar2] = val;
  ctxt->space = piVar3 + ctxt->spaceNr;
  iVar2 = ctxt->spaceNr + 1;
  ctxt->spaceNr = iVar2;
  return iVar2;
}

Assistant:

static int spacePush(xmlParserCtxtPtr ctxt, int val) {
    if (ctxt->spaceNr >= ctxt->spaceMax) {
        int *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->spaceMax, sizeof(tmp[0]),
                                  10, XML_MAX_ITEMS);
        if (newSize < 0) {
	    xmlErrMemory(ctxt);
	    return(-1);
        }

        tmp = xmlRealloc(ctxt->spaceTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
	    xmlErrMemory(ctxt);
	    return(-1);
	}
	ctxt->spaceTab = tmp;

        ctxt->spaceMax = newSize;
    }
    ctxt->spaceTab[ctxt->spaceNr] = val;
    ctxt->space = &ctxt->spaceTab[ctxt->spaceNr];
    return(ctxt->spaceNr++);
}